

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall happly::PLYData::parseASCII(PLYData *this,istream *inStream,bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  pointer pPVar4;
  ulong uVar5;
  vector<happly::Element,_std::allocator<happly::Element>_> *pvVar6;
  byte in_DL;
  istream *in_RSI;
  string *in_RDI;
  size_t iP_1;
  size_t iTok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string line;
  size_t iEntry;
  size_t iP;
  Element *elem;
  iterator __end2;
  iterator __begin2;
  vector<happly::Element,_std::allocator<happly::Element>_> *__range2;
  vector<happly::Element,_std::allocator<happly::Element>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  vector<happly::Element,_std::allocator<happly::Element>_> *in_stack_ffffffffffffff60;
  undefined8 local_98;
  undefined1 local_90 [40];
  string local_68 [32];
  ulong local_48;
  ulong local_40;
  reference local_38;
  Element *local_30;
  __normal_iterator<happly::Element_*,_std::vector<happly::Element,_std::allocator<happly::Element>_>_>
  local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_20;
  byte local_11;
  istream *local_10;
  
  local_11 = in_DL & 1;
  local_20 = &in_RDI[1].field_2;
  local_10 = in_RSI;
  local_28._M_current =
       (Element *)
       geometrycentral::surface::std::vector<happly::Element,_std::allocator<happly::Element>_>::
       begin(in_stack_ffffffffffffff48);
  local_30 = (Element *)
             geometrycentral::surface::std::
             vector<happly::Element,_std::allocator<happly::Element>_>::end
                       (in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<happly::Element_*,_std::vector<happly::Element,_std::allocator<happly::Element>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<happly::Element_*,_std::vector<happly::Element,_std::allocator<happly::Element>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<happly::Element_*,_std::vector<happly::Element,_std::allocator<happly::Element>_>_>
               ::operator*(&local_28);
    if ((local_11 & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"  - Processing element: ");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    for (local_40 = 0; uVar5 = local_40,
        sVar3 = geometrycentral::surface::std::
                vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                ::size(&local_38->properties), uVar5 < sVar3; local_40 = local_40 + 1) {
      geometrycentral::surface::std::
      vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
      ::operator[](&local_38->properties,local_40);
      pPVar4 = geometrycentral::surface::std::
               unique_ptr<happly::Property,_std::default_delete<happly::Property>_>::operator->
                         ((unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *)
                          0x27c0ae);
      (*pPVar4->_vptr_Property[2])(pPVar4,local_38->count);
    }
    for (local_48 = 0; local_48 < local_38->count; local_48 = local_48 + 1) {
      in_stack_ffffffffffffff50 = local_68;
      std::__cxx11::string::string(in_stack_ffffffffffffff50);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (local_10,in_stack_ffffffffffffff50);
      bVar1 = geometrycentral::surface::std::
              vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
              ::empty((vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                       *)in_stack_ffffffffffffff60);
      if (!bVar1) {
        while (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_68);
        }
      }
      anon_unknown_3::tokenSplit(in_RDI);
      local_98 = 0;
      in_stack_ffffffffffffff48 = (vector<happly::Element,_std::allocator<happly::Element>_> *)0x0;
      while (in_stack_ffffffffffffff60 = in_stack_ffffffffffffff48,
            pvVar6 = (vector<happly::Element,_std::allocator<happly::Element>_> *)
                     geometrycentral::surface::std::
                     vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
                     ::size(&local_38->properties), in_stack_ffffffffffffff48 < pvVar6) {
        geometrycentral::surface::std::
        vector<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
        ::operator[](&local_38->properties,(size_type)in_stack_ffffffffffffff60);
        pPVar4 = geometrycentral::surface::std::
                 unique_ptr<happly::Property,_std::default_delete<happly::Property>_>::operator->
                           ((unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *)
                            0x27c1cf);
        (*pPVar4->_vptr_Property[3])(pPVar4,local_90,&local_98);
        in_stack_ffffffffffffff48 =
             (vector<happly::Element,_std::allocator<happly::Element>_> *)
             ((long)&(in_stack_ffffffffffffff60->
                     super__Vector_base<happly::Element,_std::allocator<happly::Element>_>)._M_impl.
                     super__Vector_impl_data._M_start + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff60);
      std::__cxx11::string::~string(local_68);
    }
    __gnu_cxx::
    __normal_iterator<happly::Element_*,_std::vector<happly::Element,_std::allocator<happly::Element>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void parseASCII(std::istream& inStream, bool verbose) {

    using std::string;
    using std::vector;

    // Read all elements
    for (Element& elem : elements) {

      if (verbose) {
        std::cout << "  - Processing element: " << elem.name << std::endl;
      }

      for (size_t iP = 0; iP < elem.properties.size(); iP++) {
        elem.properties[iP]->reserve(elem.count);
      }
      for (size_t iEntry = 0; iEntry < elem.count; iEntry++) {

        string line;
        std::getline(inStream, line);

        // Some .ply files seem to include empty lines before the start of property data (though this is not specified
        // in the format description). We attempt to recover and parse such files by skipping any empty lines.
        if (!elem.properties.empty()) { // if the element has no properties, the line _should_ be blank, presumably
          while (line.empty()) { // skip lines until we hit something nonempty
            std::getline(inStream, line);
          }
        }

        vector<string> tokens = tokenSplit(line);
        size_t iTok = 0;
        for (size_t iP = 0; iP < elem.properties.size(); iP++) {
          elem.properties[iP]->parseNext(tokens, iTok);
        }
      }
    }
  }